

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O3

void __thiscall
writer_test_should_write_utc_timestamp_field_with_microseconds_Test::TestBody
          (writer_test_should_write_utc_timestamp_field_with_microseconds_Test *this)

{
  bool bVar1;
  int y;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  size_t __n;
  char *message;
  long lVar6;
  ostringstream local_1e8 [8];
  ostringstream oss;
  ios_base local_178 [264];
  long local_70 [3];
  undefined1 local_58;
  internal local_50 [8];
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  AssertHelper local_20;
  
  lVar6 = 0;
  time((time_t *)0x0);
  uVar3 = 0x7b2;
  iVar4 = -0x7b2;
  do {
    lVar5 = 0x1e13380;
    if ((uVar3 & 3) == 0) {
      lVar5 = 0x1e28500;
      if ((int)(uVar3 / 400) * 400 + iVar4 != 0) {
        lVar5 = 0x1e13380;
      }
      if ((int)(uVar3 / 100) * 100 + iVar4 != 0) {
        lVar5 = 0x1e28500;
      }
    }
    lVar6 = lVar6 + lVar5;
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
    iVar4 = iVar4 + -1;
  } while (uVar2 != 0x7e1);
  local_70[0] = lVar6 + 0xb2bbfa;
  local_70[1] = 0x10000007b;
  local_70[2] = 0x1000001c8;
  local_58 = 0;
  std::__cxx11::ostringstream::ostringstream(local_1e8);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>_>::write
            ((int)local_1e8,local_70,__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            (local_50,"oss.str()","\"52=20170516-13:45:30.123456|\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [29])"52=20170516-13:45:30.123456|");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar.message_.ptr_ != &local_30) {
    operator_delete(gtest_ar.message_.ptr_,local_30._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0xb9,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::ostringstream::~ostringstream(local_1e8);
  std::ios_base::~ios_base(local_178);
  return;
}

Assistant:

TEST(writer_test, should_write_utc_timestamp_field_with_microseconds)
{
    using Field = Fixpp::Field<Fixpp::Tag::SendingTime>;
    Field field;

    std::tm tm{};
    tm.tm_year = 117;
    tm.tm_mon = 4;
    tm.tm_mday = 16;
    tm.tm_hour = 13;
    tm.tm_min = 45;
    tm.tm_sec = 30;

    auto ts = mkgmtime(&tm);
    field.set(Fixpp::Type::UTCTimestamp::Time{ts, 123, 456});

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "52=20170516-13:45:30.123456|");
}